

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

int Ssw_ManSweepNode(Ssw_Man_t *p,Aig_Obj_t *pObj,int f,int fBmc,Vec_Int_t *vPairs)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  long lVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pOld;
  timespec ts;
  long local_58;
  timespec local_48;
  Vec_Int_t *local_38;
  
  ppAVar1 = p->pAig->pReprs;
  iVar3 = 0;
  if (ppAVar1 != (Aig_Obj_t **)0x0) {
    pRepr = ppAVar1[pObj->Id];
    iVar3 = 0;
    if (pRepr != (Aig_Obj_t *)0x0) {
      pAVar6 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
      if ((pAVar6 == (Aig_Obj_t *)0x0) ||
         (pAVar2 = p->pNodeToFrames[p->nFrames * pRepr->Id + f], pAVar2 == (Aig_Obj_t *)0x0)) {
        __assert_fail("pObjFraig != NULL && pObjReprFraig != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                      ,0xc9,"int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)")
        ;
      }
      pOld = (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
      pAVar7 = (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
      if ((((byte)((*(uint *)&pOld->field_0x18 ^ *(uint *)&pAVar7->field_0x18) >> 3) ^
            (byte)pAVar6 ^ (byte)pAVar2 ^
           ((*(uint *)&pRepr->field_0x18 ^ *(uint *)&pObj->field_0x18) & 8) == 0) & 1) == 0) {
        __assert_fail("(pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                      ,0xca,"int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)")
        ;
      }
      iVar3 = 0;
      if (pOld != pAVar7) {
        local_38 = vPairs;
        if ((fBmc == 0) && (p->pPars->fDynamic != 0)) {
          iVar3 = clock_gettime(3,&local_48);
          if (iVar3 < 0) {
            local_58 = 1;
          }
          else {
            lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
            local_58 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
          }
          Ssw_ManLoadSolver(p,pRepr,pObj);
          p->nRecycleCalls = p->nRecycleCalls + 1;
          iVar3 = clock_gettime(3,&local_48);
          if (iVar3 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          p->timeMarkCones = p->timeMarkCones + lVar5 + local_58;
        }
        pAVar6 = pAVar7;
        if (p->pFrames->pConst1 != pOld) {
          pAVar6 = pOld;
          pOld = pAVar7;
        }
        iVar4 = Ssw_NodesAreEquiv(p,pOld,pAVar6);
        p_00 = local_38;
        iVar3 = 0;
        if (iVar4 == 1) {
          p->pNodeToFrames[pObj->Id * p->nFrames + f] =
               (Aig_Obj_t *)
               ((ulong)((*(uint *)&pRepr->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
               (ulong)pAVar2);
          if ((local_38 != (Vec_Int_t *)0x0) && (p->pPars->fEquivDump2 != 0)) {
            Vec_IntPush(local_38,pRepr->Id);
            Vec_IntPush(p_00,pObj->Id);
            iVar3 = 0;
          }
        }
        else {
          if ((local_38 != (Vec_Int_t *)0x0) && (p->pPars->fEquivDump != 0)) {
            Vec_IntPush(local_38,pRepr->Id);
            Vec_IntPush(p_00,pObj->Id);
          }
          if (iVar4 == -1) {
            Ssw_ClassesRemoveNode(p->ppClasses,pObj);
          }
          else {
            if ((fBmc != 0) || (p->pPars->fDynamic == 0)) {
              Ssw_SmlSavePatternAig(p,f);
              if (p->pPars->fConstrs == 0) {
                Ssw_ManResimulateWord(p,pObj,pRepr,f);
              }
              else {
                Ssw_ManResimulateBit(p,pObj,pRepr);
              }
              ppAVar1 = p->pAig->pReprs;
              if (ppAVar1 == (Aig_Obj_t **)0x0) {
                return 1;
              }
              if (ppAVar1[pObj->Id] != pRepr) {
                return 1;
              }
              __assert_fail("Aig_ObjRepr( p->pAig, pObj ) != pObjRepr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                            ,0xfd,
                            "int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)")
              ;
            }
            Ssw_SmlAddPatternDyn(p);
            p->nPatterns = p->nPatterns + 1;
          }
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Ssw_ManSweepNode( Ssw_Man_t * p, Aig_Obj_t * pObj, int f, int fBmc, Vec_Int_t * vPairs )
{
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    abctime clk;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAig, pObj );
    if ( pObjRepr == NULL )
        return 0;
    // get the fraiged node
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    // get the fraiged representative
    pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, f );
    // check if constant 0 pattern distinquishes these nodes
    assert( pObjFraig != NULL && pObjReprFraig != NULL );
    assert( (pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return 0;
    // add constraints on demand
    if ( !fBmc && p->pPars->fDynamic )
    {
clk = Abc_Clock();
        Ssw_ManLoadSolver( p, pObjRepr, pObj );
        p->nRecycleCalls++;
p->timeMarkCones += Abc_Clock() - clk;
    }
    // call equivalence checking
    if ( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pFrames) )
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    else
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Ssw_ObjSetFrame( p, pObj, f, pObjFraig2 );
        if ( p->pPars->fEquivDump2 && vPairs )
        {
            Vec_IntPush( vPairs, pObjRepr->Id );
            Vec_IntPush( vPairs, pObj->Id );
        }
        return 0;
    }
    if ( p->pPars->fEquivDump && vPairs )
    {
        Vec_IntPush( vPairs, pObjRepr->Id );
        Vec_IntPush( vPairs, pObj->Id );
    }
    if ( RetValue == -1 ) // timed out
    {
        Ssw_ClassesRemoveNode( p->ppClasses, pObj );
        return 1;
    }
    // disproved the equivalence
    if ( !fBmc && p->pPars->fDynamic )
    {
        Ssw_SmlAddPatternDyn( p );
        p->nPatterns++;
        return 1;
    }
    else
        Ssw_SmlSavePatternAig( p, f );
    if ( !p->pPars->fConstrs )
        Ssw_ManResimulateWord( p, pObj, pObjRepr, f );
    else
        Ssw_ManResimulateBit( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAig, pObj ) != pObjRepr );
    if ( Aig_ObjRepr( p->pAig, pObj ) == pObjRepr )
    {
        Abc_Print( 1, "Ssw_ManSweepNode(): Failed to refine representative.\n" );
    }
    return 1;
}